

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

void __thiscall gmath::PinholeCamera::PinholeCamera(PinholeCamera *this,PinholeCamera *pc)

{
  pointer pcVar1;
  double dVar2;
  int iVar3;
  Matrix33d *pMVar4;
  Matrix33d *pMVar5;
  undefined4 extraout_var;
  int k;
  long lVar6;
  long lVar7;
  
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_00126b98;
  (this->super_Camera).name._M_dataplus._M_p = (pointer)&(this->super_Camera).name.field_2;
  pcVar1 = (pc->super_Camera).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Camera).name,pcVar1,
             pcVar1 + (pc->super_Camera).name._M_string_length);
  lVar6 = (pc->super_Camera).height;
  (this->super_Camera).width = (pc->super_Camera).width;
  (this->super_Camera).height = lVar6;
  pMVar4 = &(this->super_Camera).R;
  pMVar5 = &(pc->super_Camera).R;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      pMVar4->v[0][lVar7] = pMVar5->v[0][lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    pMVar5 = (Matrix33d *)(pMVar5->v + 1);
  } while (lVar6 != 3);
  lVar6 = 0x10;
  do {
    *(undefined8 *)((long)((this->super_Camera).R.v + -3) + 0x10 + lVar6 * 8) =
         *(undefined8 *)((long)((pc->super_Camera).R.v + -3) + 0x10 + lVar6 * 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x13);
  dVar2 = (pc->super_Camera).zmax;
  (this->super_Camera).zmin = (pc->super_Camera).zmin;
  (this->super_Camera).zmax = dVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->super_Camera).match,&(pc->super_Camera).match);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__PinholeCamera_00126bf8;
  pMVar4 = &this->A;
  pMVar5 = &pc->A;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      pMVar4->v[0][lVar7] = pMVar5->v[0][lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    pMVar5 = (Matrix33d *)(pMVar5->v + 1);
  } while (lVar6 != 3);
  this->rho = pc->rho;
  this->dist = (Distortion *)0x0;
  if (pc->dist != (Distortion *)0x0) {
    iVar3 = (*pc->dist->_vptr_Distortion[2])();
    this->dist = (Distortion *)CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

PinholeCamera::PinholeCamera(const PinholeCamera &pc) : Camera(pc), A(pc.A)
{
  rho=pc.rho;

  dist=0;

  if (pc.dist != 0)
  {
    dist=pc.dist->clone();
  }
}